

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

SUNErrCode SUNLogger_Destroy(SUNLogger *logger_ptr)

{
  int iVar1;
  SUNLogger *in_RDI;
  SUNLogger logger;
  int retval;
  SUNLogger logger_00;
  undefined4 in_stack_ffffffffffffffe8;
  SUNErrCode local_4;
  
  local_4 = 0;
  if (in_RDI == (SUNLogger *)0x0) {
    local_4 = 0;
  }
  else {
    logger_00 = *in_RDI;
    if ((logger_00 == (SUNLogger)0x0) ||
       (logger_00->destroy == (_func_SUNErrCode_SUNLogger_ptr *)0x0)) {
      if (logger_00 != (SUNLogger)0x0) {
        iVar1 = sunLoggerIsOutputRank(logger_00,(int *)0x0);
        if (iVar1 != 0) {
          SUNHashMap_Destroy((SUNHashMap *)CONCAT44(local_4,in_stack_ffffffffffffffe8),
                             (_func_void_void_ptr *)logger_00);
        }
        free(logger_00);
      }
    }
    else {
      local_4 = (*logger_00->destroy)(in_RDI);
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNLogger_Destroy(SUNLogger* logger_ptr)
{
  int retval       = 0;
  SUNLogger logger = NULL;

  if (!logger_ptr) { return SUN_SUCCESS; }

  logger = *logger_ptr;

  if (logger && logger->destroy) { retval = logger->destroy(logger_ptr); }
  else if (logger)
  {
    /* Default implementation */

    if (sunLoggerIsOutputRank(logger, NULL))
    {
      SUNHashMap_Destroy(&logger->filenames, sunCloseLogFile);
    }

#if SUNDIALS_MPI_ENABLED
    if (logger->comm != SUN_COMM_NULL) { MPI_Comm_free(&logger->comm); }
#endif

    free(logger);
    logger = NULL;
  }

  return retval;
}